

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O0

void __thiscall
cppnet::BaseLogger::BaseLogger(BaseLogger *this,uint16_t cache_size,uint16_t block_size)

{
  shared_ptr<cppnet::NormalAlloter> local_38 [2];
  uint16_t local_14;
  uint16_t local_12;
  uint16_t block_size_local;
  BaseLogger *pBStack_10;
  uint16_t cache_size_local;
  BaseLogger *this_local;
  
  this->_level = 0xf;
  this->_cache_size = cache_size;
  this->_block_size = block_size;
  local_14 = block_size;
  local_12 = cache_size;
  pBStack_10 = this;
  std::shared_ptr<cppnet::Alloter>::shared_ptr(&this->_allocter);
  ThreadSafeQueue<cppnet::Log_*>::ThreadSafeQueue(&this->_cache_queue);
  std::shared_ptr<cppnet::Logger>::shared_ptr(&this->_logger);
  MakeNormalAlloterPtr();
  std::shared_ptr<cppnet::Alloter>::operator=(&this->_allocter,local_38);
  std::shared_ptr<cppnet::NormalAlloter>::~shared_ptr(local_38);
  return;
}

Assistant:

BaseLogger::BaseLogger(uint16_t cache_size, uint16_t block_size):
    _level(LL_INFO),
    _cache_size(cache_size),
    _block_size(block_size) {

    _allocter = MakeNormalAlloterPtr();
}